

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::maybe_connect_web_seeds(torrent *this)

{
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *plVar1;
  undefined8 uVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  time_point32 tVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Self __tmp;
  iterator web;
  unique_lock<std::mutex> local_38;
  
  uVar2 = *(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
  if ((((uint)uVar2 >> 0x1a & 1) == 0) &&
     (plVar1 = &this->m_web_seeds,
     (this->m_web_seeds).
     super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
     _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)plVar1)) {
    bVar4 = is_finished(this);
    if ((!bVar4) &&
       (((this->field_0x5c0 & 8) != 0 &&
        ((int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             .
                             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_torrent_hot_members).m_connections.
                            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            .
                            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) -
         (int)((ulong)((long)(this->m_peers_to_disconnect).
                             super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_peers_to_disconnect).
                            super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) <
         (int)((uint)((ulong)uVar2 >> 0x21) & 0xffffff))))) {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x1e])();
      iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      local_38._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar6) + 0x438);
      local_38._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_38);
      local_38._M_owns = true;
      iVar6 = *(int *)(CONCAT44(extraout_var,iVar6) + 0x2fc);
      ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
      if (iVar5 < iVar6) {
        iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x2e])();
        iVar6 = session_settings::get_int
                          ((session_settings *)CONCAT44(extraout_var_00,iVar6),0x4083);
        tVar7 = time_now32();
        web._M_node = (this->m_web_seeds).
                      super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
        if (web._M_node != (_List_node_base *)plVar1) {
          iVar5 = 100;
          if (0 < iVar6) {
            iVar5 = iVar6;
          }
          do {
            p_Var3 = (web._M_node)->_M_next;
            if ((((*(char *)((long)&web._M_node[0xb]._M_next + 6) == '\0') &&
                 (*(char *)((long)&web._M_node[0xb]._M_next + 2) == '\0')) &&
                (*(int *)((long)&web._M_node[6]._M_prev + 4) <= (int)tVar7.__d.__r)) &&
               (*(char *)((long)&web._M_node[0xb]._M_next + 3) == '\x01')) {
              iVar5 = iVar5 + -1;
              if ((web._M_node[9]._M_next == (_List_node_base *)0x0) &&
                 (*(char *)((long)&web._M_node[0xb]._M_next + 1) == '\0')) {
                connect_to_url_seed(this,web);
              }
            }
          } while ((p_Var3 != (_List_node_base *)plVar1) && (web._M_node = p_Var3, 0 < iVar5));
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::maybe_connect_web_seeds()
	{
		if (m_abort) return;

		// if we have everything we want we don't need to connect to any web-seed
		if (m_web_seeds.empty()
			|| is_finished()
			|| !m_files_checked
			|| num_peers() >= int(m_max_connections)
			|| m_ses.num_connections() >= settings().get_int(settings_pack::connections_limit))
		{
			return;
		}

		// when set to unlimited, use 100 as the limit
		int limit = zero_or(settings().get_int(settings_pack::max_web_seed_connections)
			, 100);

		auto const now = aux::time_now32();

		// keep trying web-seeds if there are any
		// first find out which web seeds we are connected to
		for (auto i = m_web_seeds.begin(); i != m_web_seeds.end() && limit > 0;)
		{
			auto const w = i++;
			if (w->disabled || w->removed || w->retry > now || !w->interesting)
				continue;

			--limit;
			if (w->peer_info.connection || w->resolving)
				continue;

			connect_to_url_seed(w);
		}
	}